

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall cs222::Parser::parseLabel(Parser *this,string *token,string *label)

{
  bool bVar1;
  undefined8 extraout_RAX;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (token,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                           label_regex_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)label);
    return;
  }
  std::__cxx11::string::string((string *)&local_38,"illegal symbol name: ",&local_59);
  std::operator+(&local_58,&local_38,token);
  throwError(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::parseLabel(const std::string& token, std::string& label) const
    {
        if (std::regex_match(token, label_regex))
        {
            label = token;
        }
        else
        {
            throwError(std::string("illegal symbol name: ") + token);
        }
    }